

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseBoolFlag(char *str,char *flag,bool *value)

{
  char *pcVar1;
  byte *in_RDX;
  char *value_str;
  undefined1 local_29;
  undefined1 local_1;
  
  pcVar1 = ParseFlagValue(str,flag,value._7_1_);
  if (pcVar1 == (char *)0x0) {
    local_1 = false;
  }
  else {
    local_29 = true;
    if ((*pcVar1 != '0') && (local_29 = true, *pcVar1 != 'f')) {
      local_29 = *pcVar1 == 'F';
    }
    *in_RDX = (local_29 ^ 0xffU) & 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ParseBoolFlag(const char* str, const char* flag, bool* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, true);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Converts the string value to a bool.
  *value = !(*value_str == '0' || *value_str == 'f' || *value_str == 'F');
  return true;
}